

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O3

void read_rbsp_slice_trailing_bits(h264_stream_t *h,bs_t *b)

{
  uint8_t *puVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  
  iVar2 = b->bits_left;
  if (iVar2 != 1) {
    if (iVar2 == 9) goto LAB_00129b68;
    do {
      if (iVar2 == 10) goto LAB_00129b68;
      bVar4 = iVar2 != 2;
      iVar2 = iVar2 + -1;
    } while (bVar4);
  }
  b->p = b->p + 1;
LAB_00129b68:
  b->bits_left = 8;
  if (h->pps->entropy_coding_mode_flag != 0) {
    puVar1 = b->p;
    if (puVar1 < b->end) {
      iVar3 = 0;
      iVar2 = 8;
      do {
        iVar2 = iVar2 + -1;
        if (iVar2 == 0) {
          puVar1 = puVar1 + 1;
          b->p = puVar1;
          iVar2 = 8;
        }
        iVar3 = iVar3 + 1;
      } while ((iVar3 != 0x10) || (iVar3 = 0, puVar1 < b->end));
      b->bits_left = iVar2;
    }
  }
  return;
}

Assistant:

void read_rbsp_slice_trailing_bits(h264_stream_t* h, bs_t* b)
{
    read_rbsp_trailing_bits(b);
    if( h->pps->entropy_coding_mode_flag )
    {
        while( more_rbsp_trailing_data(h, b) )
        {
            /* cabac_zero_word */ bs_skip_u(b, 16);
        }
    }
}